

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::String::String(String *this,tagbstring *x)

{
  int iVar1;
  uchar *__dest;
  size_t __n;
  
  iVar1 = x->slen;
  __n = (size_t)iVar1;
  (this->super_tagbstring).data = (uchar *)0x0;
  (this->super_tagbstring).slen = iVar1;
  (this->super_tagbstring).mlen = iVar1 + 1U;
  if ((-1 < (long)__n) && (x->data != (uchar *)0x0)) {
    __dest = (uchar *)malloc((ulong)(iVar1 + 1U));
    (this->super_tagbstring).data = __dest;
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,x->data,__n);
      __dest[__n] = '\0';
      return;
    }
  }
  fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
          "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
          ,0xb9,"Failure in (tagbstring) constructor");
  return;
}

Assistant:

String::String(const tagbstring& x)
    {
        slen = x.slen;
        mlen = slen + 1;
        data = 0;
        if (slen >= 0 && x.data != NULL)
            data = (uint8 * ) malloc(mlen);
        if (!data)
        {
            bstringThrow("Failure in (tagbstring) constructor");
        }
        else
        {
            memcpy(data, x.data, slen);
            data[slen] = '\0';
        }
    }